

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessStartJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  Error *pEVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  char *begin;
  char *pcVar6;
  string *this_00;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint16_t port;
  undefined1 local_118 [8];
  string local_110;
  parse_func local_f0 [1];
  Error error;
  string existingCommissionerId;
  undefined1 local_a0 [40];
  string local_78;
  undefined1 local_58 [40];
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  existingCommissionerId._M_dataplus._M_p = (pointer)&existingCommissionerId.field_2;
  existingCommissionerId._M_string_length = 0;
  existingCommissionerId.field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_118._0_4_ = none_type;
    local_110._M_dataplus._M_p = "too few arguments";
    local_110._M_string_length = 0x11;
    local_110.field_2._M_allocated_capacity = 0;
    local_f0[0] = (parse_func)0x0;
    pcVar6 = "too few arguments";
    local_110.field_2._8_8_ = (format_string_checker<char> *)local_118;
    while (begin = pcVar6, begin != "") {
      pcVar6 = begin + 1;
      if (*begin == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_118);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_118;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_78,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_a0._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_a0 + 8),(string *)&local_78);
    Error::operator=(&error,(Error *)local_a0);
    std::__cxx11::string::~string((string *)(local_a0 + 8));
    this_00 = &local_78;
LAB_001fb065:
    std::__cxx11::string::~string((string *)this_00);
LAB_001fb06a:
    EVar1 = error.mCode;
    if (existingCommissionerId._M_string_length == 0) goto LAB_001fb0cc;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "there is an existing active commissioner: ",&existingCommissionerId);
    local_118._0_4_ = EVar1;
    std::__cxx11::string::string((string *)(local_118 + 8),(string *)local_a0);
    Error::operator=(&error,(Error *)local_118);
    std::__cxx11::string::~string((string *)(local_118 + 8));
    this_01 = (string *)local_a0;
  }
  else {
    utils::ParseInteger<unsigned_short>((Error *)local_118,&port,pbVar2 + 2);
    pEVar4 = Error::operator=(&error,(Error *)local_118);
    EVar1 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)(local_118 + 8));
    if (EVar1 != kNone) goto LAB_001fb06a;
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                      ((this->mContext).mCommandKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->mContext).mCommandKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"--connect-only");
    if (_Var5._M_current ==
        (this->mContext).mCommandKeys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      peVar3 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0xc])
                (local_118,peVar3,&existingCommissionerId,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)port);
      Error::operator=(&error,(Error *)local_118);
      this_00 = (string *)(local_118 + 8);
      goto LAB_001fb065;
    }
    peVar3 = (aCommissioner->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[10])
              (local_118,peVar3,
               (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,(ulong)port);
    Error::operator=(&error,(Error *)local_118);
    this_01 = (string *)(local_118 + 8);
  }
  std::__cxx11::string::~string(this_01);
LAB_001fb0cc:
  Error::Error((Error *)local_58,&error);
  Value::Value(__return_storage_ptr__,(Error *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&existingCommissionerId);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStartJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Error       error;
    uint16_t    port;
    std::string existingCommissionerId;
    bool        connectOnly = false;

    VerifyOrExit(aExpr.size() >= 3, error = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(error = ParseInteger(port, aExpr[2]));

    {
        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--connect-only");

        if (it != mContext.mCommandKeys.end())
        {
            connectOnly = true;
            error       = aCommissioner->Connect(aExpr[1], port);
        }
        else
        {
            error = aCommissioner->Start(existingCommissionerId, aExpr[1], port);
        }
    }

exit:
    if (!connectOnly && !existingCommissionerId.empty())
    {
        error = Error{error.GetCode(), "there is an existing active commissioner: " + existingCommissionerId};
    }
    return error;
}